

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# databaseinfo.cpp
# Opt level: O2

void __thiscall DatabaseInfo::acceptWidget(DatabaseInfo *this,DomWidget *node)

{
  DomStringList *pDVar1;
  QString *args;
  bool bVar2;
  DomProperty *pDVar3;
  QList<QString> *pQVar4;
  long in_FS_OFFSET;
  QHash<QString,_DomProperty_*> properties;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<QString> local_50;
  QHash<QString,_DomProperty_*> local_38;
  DomProperty **local_30;
  
  local_30 = *(DomProperty ***)(in_FS_OFFSET + 0x28);
  local_38.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_50.d = (Data *)(node->m_property).d.d;
  local_50.ptr = (QString *)(node->m_property).d.ptr;
  local_50.size = (node->m_property).d.size;
  if (local_50.d != (Data *)0x0) {
    LOCK();
    (((Data *)local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  propertyMap((QList<DomProperty_*> *)&local_38);
  QArrayDataPointer<DomProperty_*>::~QArrayDataPointer
            ((QArrayDataPointer<DomProperty_*> *)&local_50);
  local_50.d = (Data *)0xd;
  local_50.ptr = (QString *)0x16f845;
  pDVar3 = QHash<QString,_DomProperty_*>::value<QLatin1String,_true>
                     (&local_38,(QLatin1String *)&local_50);
  if (pDVar3 != (DomProperty *)0x0) {
    local_50.d = (Data *)(pDVar3->m_bool).d.d;
    local_50.ptr = (QString *)(pDVar3->m_bool).d.ptr;
    local_50.size = (pDVar3->m_bool).d.size;
    if (local_50.d != (Data *)0x0) {
      LOCK();
      (((Data *)local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar2 = toBool((QString *)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_50);
    if (!bVar2) goto LAB_0013aeea;
  }
  local_50.d = (Data *)0x8;
  local_50.ptr = (QString *)0x16f83c;
  pDVar3 = QHash<QString,_DomProperty_*>::value<QLatin1String,_true>
                     (&local_38,(QLatin1String *)&local_50);
  if ((pDVar3 == (DomProperty *)0x0) ||
     (pDVar1 = pDVar3->m_stringList, pDVar1 == (DomStringList *)0x0)) {
LAB_0013aea4:
    TreeWalker::acceptWidget(&this->super_TreeWalker,node);
  }
  else {
    local_50.d = (pDVar1->m_string).d.d;
    args = (pDVar1->m_string).d.ptr;
    local_50.size = (pDVar1->m_string).d.size;
    if (local_50.d != (Data *)0x0) {
      LOCK();
      (((Data *)local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_50.ptr = args;
    if ((local_50.size != 0) && ((args->d).size != 0)) {
      QList<QString>::emplaceBack<QString_const&>(&this->m_connections,args);
      if ((ulong)local_50.size < 2) {
        local_68.d = (Data *)0x0;
        local_68.ptr = (char16_t *)0x0;
        local_68.size = 0;
      }
      else {
        local_68.d = local_50.ptr[1].d.d;
        local_68.ptr = local_50.ptr[1].d.ptr;
        local_68.size = local_50.ptr[1].d.size;
        if (local_68.d != (Data *)0x0) {
          LOCK();
          ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        if (local_68.size != 0) {
          pQVar4 = QMap<QString,_QList<QString>_>::operator[](&this->m_cursors,args);
          QList<QString>::emplaceBack<QString_const&>(pQVar4,(QString *)&local_68);
          if ((ulong)local_50.size < 3) {
            local_88.d = (Data *)0x0;
            local_88.ptr = (char16_t *)0x0;
            local_88.size = 0;
          }
          else {
            local_88.d = local_50.ptr[2].d.d;
            local_88.ptr = local_50.ptr[2].d.ptr;
            local_88.size = local_50.ptr[2].d.size;
            if (local_88.d != (Data *)0x0) {
              LOCK();
              ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            if (local_88.size != 0) {
              pQVar4 = QMap<QString,_QList<QString>_>::operator[](&this->m_fields,args);
              QList<QString>::emplaceBack<QString_const&>(pQVar4,(QString *)&local_88);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
              QArrayDataPointer<QString>::~QArrayDataPointer(&local_50);
              goto LAB_0013aea4;
            }
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
        }
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_50);
  }
LAB_0013aeea:
  QHash<QString,_DomProperty_*>::~QHash(&local_38);
  if (*(DomProperty ***)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DatabaseInfo::acceptWidget(DomWidget *node)
{
    QHash<QString, DomProperty*> properties = propertyMap(node->elementProperty());

    DomProperty *frameworkCode = properties.value("frameworkCode"_L1);
    if (frameworkCode && !toBool(frameworkCode->elementBool()))
        return;

    DomProperty *db = properties.value("database"_L1);
    if (db && db->elementStringList()) {
        QStringList info = db->elementStringList()->elementString();
        if (info.isEmpty() || info.constFirst().isEmpty())
            return;
        const QString &connection = info.constFirst();
        m_connections.append(connection);

        QString table = info.size() > 1 ? info.at(1) : QString();
        if (table.isEmpty())
            return;
        m_cursors[connection].append(table);

        QString field = info.size() > 2 ? info.at(2) : QString();
        if (field.isEmpty())
            return;
        m_fields[connection].append(field);
    }

    TreeWalker::acceptWidget(node);
}